

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O2

_Bool plutovg_surface_write_to_png_stream
                (plutovg_surface_t *surface,plutovg_write_func_t write_func,void *closure)

{
  uchar *__ptr;
  int *in_R9;
  int len;
  int local_2c;
  
  plutovg_surface_write_begin(surface);
  __ptr = stbi_write_png_to_mem
                    (surface->data,surface->stride,surface->width,surface->height,(int)&local_2c,
                     in_R9);
  if (__ptr != (uchar *)0x0) {
    (*write_func)(closure,__ptr,local_2c);
    free(__ptr);
  }
  plutovg_surface_write_end(surface);
  return __ptr != (uchar *)0x0;
}

Assistant:

bool plutovg_surface_write_to_png_stream(const plutovg_surface_t* surface, plutovg_write_func_t write_func, void* closure)
{
    plutovg_surface_write_begin(surface);
    int success = stbi_write_png_to_func(write_func, closure, surface->width, surface->height, 4, surface->data, surface->stride);
    plutovg_surface_write_end(surface);
    return success;
}